

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

int __thiscall
slang::SmallVectorBase<const_slang::ast::VariableSymbol_*>::copy
          (SmallVectorBase<const_slang::ast::VariableSymbol_*> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  VariableSymbol **first;
  size_type count;
  int local_20 [4];
  
  if (this->len != 0) {
    first = (VariableSymbol **)BumpAllocator::allocate((BumpAllocator *)dst,this->len << 3,8);
    if (this->len == 0) {
      count = 0;
    }
    else {
      memmove(first,this->data_,this->len << 3);
      count = this->len;
    }
    nonstd::span_lite::span<slang::ast::VariableSymbol_const*,18446744073709551615ul>::
    span<slang::ast::VariableSymbol_const**>
              ((span<slang::ast::VariableSymbol_const*,18446744073709551615ul> *)local_20,first,
               count);
    return local_20[0];
  }
  return 0;
}

Assistant:

[[nodiscard]] span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::uninitialized_copy(begin(), end(), dest);

        return span<T>(dest, len);
    }